

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffkshf(fitsfile *fptr,int colmin,int colmax,int incre,int *status)

{
  int iVar1;
  size_t sVar2;
  char local_148 [8];
  char newkey [75];
  char q [75];
  char rec [81];
  long local_48;
  long ivalue;
  int local_38;
  int i1;
  int tstatus;
  int nrec;
  int nmore;
  int nkeys;
  int *status_local;
  int local_18;
  int incre_local;
  int colmax_local;
  int colmin_local;
  fitsfile *fptr_local;
  
  _nmore = status;
  status_local._4_4_ = incre;
  local_18 = colmax;
  incre_local = colmin;
  _colmax_local = fptr;
  ffghsp(fptr,&nrec,&tstatus,status);
  for (i1 = 9; i1 <= nrec; i1 = i1 + 1) {
    ffgrec(_colmax_local,i1,q + 0x48,_nmore);
    if (q[0x48] == 'T') {
      ivalue._4_4_ = 0;
      strncpy(newkey + 0x48,q + 0x49,4);
      iVar1 = strncmp(newkey + 0x48,"BCOL",4);
      if (((((iVar1 == 0) || (iVar1 = strncmp(newkey + 0x48,"FORM",4), iVar1 == 0)) ||
           (iVar1 = strncmp(newkey + 0x48,"TYPE",4), iVar1 == 0)) ||
          (((iVar1 = strncmp(newkey + 0x48,"SCAL",4), iVar1 == 0 ||
            (iVar1 = strncmp(newkey + 0x48,"UNIT",4), iVar1 == 0)) ||
           ((iVar1 = strncmp(newkey + 0x48,"NULL",4), iVar1 == 0 ||
            ((iVar1 = strncmp(newkey + 0x48,"ZERO",4), iVar1 == 0 ||
             (iVar1 = strncmp(newkey + 0x48,"DISP",4), iVar1 == 0)))))))) ||
         ((iVar1 = strncmp(newkey + 0x48,"LMIN",4), iVar1 == 0 ||
          ((((((iVar1 = strncmp(newkey + 0x48,"LMAX",4), iVar1 == 0 ||
               (iVar1 = strncmp(newkey + 0x48,"DMIN",4), iVar1 == 0)) ||
              (iVar1 = strncmp(newkey + 0x48,"DMAX",4), iVar1 == 0)) ||
             ((iVar1 = strncmp(newkey + 0x48,"CTYP",4), iVar1 == 0 ||
              (iVar1 = strncmp(newkey + 0x48,"CRPX",4), iVar1 == 0)))) ||
            ((iVar1 = strncmp(newkey + 0x48,"CRVL",4), iVar1 == 0 ||
             ((iVar1 = strncmp(newkey + 0x48,"CDLT",4), iVar1 == 0 ||
              (iVar1 = strncmp(newkey + 0x48,"CROT",4), iVar1 == 0)))))) ||
           (iVar1 = strncmp(newkey + 0x48,"CUNI",4), iVar1 == 0)))))) {
        ivalue._4_4_ = 5;
      }
      else {
        iVar1 = strncmp(q + 0x48,"TDIM",4);
        if (iVar1 == 0) {
          ivalue._4_4_ = 4;
        }
      }
      if (ivalue._4_4_ != 0) {
        newkey[0x48] = '\0';
        strncat(newkey + 0x48,q + (long)ivalue._4_4_ + 0x48,(long)(8 - ivalue._4_4_));
        local_38 = 0;
        ffc2ii(newkey + 0x48,&local_48,&local_38);
        if (((local_38 == 0) && (incre_local <= local_48)) && (local_48 <= local_18)) {
          if ((status_local._4_4_ < 1) && (local_48 == incre_local)) {
            ffdrec(_colmax_local,i1,_nmore);
            nrec = nrec + -1;
            i1 = i1 + -1;
          }
          else {
            local_48 = local_48 + status_local._4_4_;
            newkey[0x48] = '\0';
            strncat(newkey + 0x48,q + 0x48,(long)ivalue._4_4_);
            ffkeyn(newkey + 0x48,(int)local_48,local_148,_nmore);
            strncpy(q + 0x48,"        ",8);
            sVar2 = strlen(local_148);
            ivalue._4_4_ = (int)sVar2;
            strncpy(q + 0x48,local_148,(long)ivalue._4_4_);
            ffmrec(_colmax_local,i1,q + 0x48,_nmore);
          }
        }
      }
    }
  }
  return *_nmore;
}

Assistant:

int ffkshf(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colmin,      /* I - starting col. to be incremented; 1 = 1st */
           int colmax,      /* I - last column to be incremented            */
           int incre,       /* I - shift index number by this amount        */
           int *status)     /* IO - error status                            */
/*
  shift the index value on any existing column keywords
  This routine will modify the name of any keyword that begins with 'T'
  and has an index number in the range COLMIN - COLMAX, inclusive.

  if incre is positive, then the index values will be incremented.
  if incre is negative, then the kewords with index = COLMIN
  will be deleted and the index of higher numbered keywords will
  be decremented.
*/
{
    int nkeys, nmore, nrec, tstatus, i1;
    long ivalue;
    char rec[FLEN_CARD], q[FLEN_KEYWORD], newkey[FLEN_KEYWORD];

    ffghsp(fptr, &nkeys, &nmore, status);  /* get number of keywords */

    /* go thru header starting with the 9th keyword looking for 'TxxxxNNN' */

    for (nrec = 9; nrec <= nkeys; nrec++)
    {     
        ffgrec(fptr, nrec, rec, status);

        if (rec[0] == 'T')
        {
            i1 = 0;
            strncpy(q, &rec[1], 4);
            if (!strncmp(q, "BCOL", 4) || !strncmp(q, "FORM", 4) ||
                !strncmp(q, "TYPE", 4) || !strncmp(q, "SCAL", 4) ||
                !strncmp(q, "UNIT", 4) || !strncmp(q, "NULL", 4) ||
                !strncmp(q, "ZERO", 4) || !strncmp(q, "DISP", 4) ||
                !strncmp(q, "LMIN", 4) || !strncmp(q, "LMAX", 4) ||
                !strncmp(q, "DMIN", 4) || !strncmp(q, "DMAX", 4) ||
                !strncmp(q, "CTYP", 4) || !strncmp(q, "CRPX", 4) ||
                !strncmp(q, "CRVL", 4) || !strncmp(q, "CDLT", 4) ||
                !strncmp(q, "CROT", 4) || !strncmp(q, "CUNI", 4) )
              i1 = 5;
            else if (!strncmp(rec, "TDIM", 4) )
              i1 = 4;

            if (i1)
            {
              /* try reading the index number suffix */
              q[0] = '\0';
              strncat(q, &rec[i1], 8 - i1);

              tstatus = 0;
              ffc2ii(q, &ivalue, &tstatus);

              if (tstatus == 0 && ivalue >= colmin && ivalue <= colmax)
              {
                if (incre <= 0 && ivalue == colmin)       
                {
                  ffdrec(fptr, nrec, status); /* delete keyword */
                  nkeys = nkeys - 1;
                  nrec = nrec - 1;
                }
                else
                {
                  ivalue = ivalue + incre;
                  q[0] = '\0';
                  strncat(q, rec, i1);
     
                  ffkeyn(q, ivalue, newkey, status);
		  /* NOTE: because of null termination, it is not 
		     equivalent to use strcpy() for the same calls */
                  strncpy(rec, "        ", 8);    /* erase old keyword name */
                  i1 = strlen(newkey);
                  strncpy(rec, newkey, i1);   /* overwrite new keyword name */
                  ffmrec(fptr, nrec, rec, status);  /* modify the record */
                }
              }
            }
        }
    }
    return(*status);
}